

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> * __thiscall
wasm::WATParser::anon_unknown_0::ident
          (optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *__return_storage_ptr__,
          anon_unknown_0 *this,string_view in)

{
  bool bVar1;
  LexStrResult *pLVar2;
  LexResult *pLVar3;
  basic_string_view<char,_std::char_traits<char>_> sv;
  string_view sVar4;
  string_view in_00;
  string_view in_01;
  undefined1 local_138 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed_1;
  undefined1 local_110 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed;
  undefined1 local_d8 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> s;
  undefined1 local_68 [8];
  LexIdCtx ctx;
  string_view in_local;
  
  sVar4._M_str = (char *)in._M_len;
  sVar4._M_len = (size_t)this;
  ctx.str.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = this;
  LexIdCtx::LexIdCtx((LexIdCtx *)local_68,sVar4);
  sv = ::sv("$",1);
  bVar1 = LexCtx::takePrefix((LexCtx *)local_68,sv);
  if (!bVar1) {
    std::optional<wasm::WATParser::(anonymous_namespace)::LexIdResult>::optional
              (__return_storage_ptr__);
    s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
    _M_payload.
    super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
    .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._M_engaged =
         true;
    s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
    _M_payload.
    super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
    .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._57_3_ = 0;
    goto LAB_0231da2f;
  }
  sVar4 = LexCtx::next((LexCtx *)local_68);
  str((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)local_d8,sVar4);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_d8);
  if (bVar1) {
    pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::operator->
                       ((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)local_d8);
    sVar4 = LexStrResult::getStr(pLVar2);
    lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
    _16_8_ = sVar4._M_len;
    bVar1 = String::isUTF8(sVar4);
    if (bVar1) {
      ctx.super_LexCtx.lexedSize._0_1_ = 1;
      pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::operator->
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)local_d8
                         );
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&ctx.isStr,&pLVar2->str);
      pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::operator*
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)local_d8
                         );
      LexCtx::take((LexCtx *)local_68,&pLVar2->super_LexResult);
      goto LAB_0231d9bc;
    }
    std::optional<wasm::WATParser::(anonymous_namespace)::LexIdResult>::optional
              (__return_storage_ptr__);
    s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
    _M_payload.
    super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
    .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._M_engaged =
         true;
    s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
    _M_payload.
    super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
    .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._57_3_ = 0;
  }
  else {
    sVar4 = LexCtx::next((LexCtx *)local_68);
    in_00._M_len = sVar4._M_str;
    lexed_1.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
    _16_8_ = sVar4._M_len;
    in_00._M_str = (char *)lexed_1.
                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                           ._16_8_;
    idchar((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_110,
           (anon_unknown_0 *)
           lexed_1.
           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
           _M_payload.
           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._16_8_,
           in_00);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_110);
    if (bVar1) {
      pLVar3 = std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator*
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_110);
      LexCtx::take((LexCtx *)local_68,pLVar3);
      while( true ) {
        sVar4 = LexCtx::next((LexCtx *)local_68);
        in_01._M_len = sVar4._M_str;
        in_01._M_str = (char *)sVar4._M_len;
        idchar((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_138,
               (anon_unknown_0 *)sVar4._M_len,in_01);
        bVar1 = std::optional::operator_cast_to_bool((optional *)local_138);
        if (!bVar1) break;
        pLVar3 = std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator*
                           ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_138
                           );
        LexCtx::take((LexCtx *)local_68,pLVar3);
      }
LAB_0231d9bc:
      s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
      _M_payload.
      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
      .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._M_engaged
           = false;
      s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
      _M_payload.
      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
      .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._57_3_ = 0
      ;
    }
    else {
      std::optional<wasm::WATParser::(anonymous_namespace)::LexIdResult>::optional
                (__return_storage_ptr__);
      s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
      _M_payload.
      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
      .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._M_engaged
           = true;
      s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
      _M_payload.
      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
      .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._57_3_ = 0
      ;
    }
  }
  std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::~optional
            ((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)local_d8);
  if (s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
      _M_payload.
      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
      .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._56_4_ ==
      0) {
    bVar1 = LexCtx::canFinish((LexCtx *)local_68);
    if (bVar1) {
      LexIdCtx::lexed(__return_storage_ptr__,(LexIdCtx *)local_68);
      s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
      _M_payload.
      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
      .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._M_engaged
           = true;
      s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
      _M_payload.
      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
      .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._57_3_ = 0
      ;
    }
    else {
      std::optional<wasm::WATParser::(anonymous_namespace)::LexIdResult>::optional
                (__return_storage_ptr__);
      s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
      _M_payload.
      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
      .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._M_engaged
           = true;
      s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
      _M_payload.
      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
      .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._57_3_ = 0
      ;
    }
  }
LAB_0231da2f:
  LexIdCtx::~LexIdCtx((LexIdCtx *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexIdResult> ident(std::string_view in) {
  LexIdCtx ctx(in);
  if (!ctx.takePrefix("$"sv)) {
    return {};
  }
  if (auto s = str(ctx.next())) {
    if (!String::isUTF8(s->getStr())) {
      return {};
    }
    ctx.isStr = true;
    ctx.str = s->str;
    ctx.take(*s);
  } else if (auto lexed = idchar(ctx.next())) {
    ctx.take(*lexed);
    while (auto lexed = idchar(ctx.next())) {
      ctx.take(*lexed);
    }
  } else {
    return {};
  }
  if (ctx.canFinish()) {
    return ctx.lexed();
  }
  return {};
}